

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  ImFontConfig *pIVar1;
  ImFont **ppIVar2;
  ImVector<ImFontConfig> *in_RDI;
  int n;
  int i_1;
  int i;
  int local_14;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < in_RDI[6].Size; local_c = local_c + 1) {
    pIVar1 = ImVector<ImFontConfig>::operator[](in_RDI + 6,local_c);
    if (pIVar1->FontData != (void *)0x0) {
      pIVar1 = ImVector<ImFontConfig>::operator[](in_RDI + 6,local_c);
      if ((pIVar1->FontDataOwnedByAtlas & 1U) != 0) {
        ImVector<ImFontConfig>::operator[](in_RDI + 6,local_c);
        ImGui::MemFree(in_RDI);
        pIVar1 = ImVector<ImFontConfig>::operator[](in_RDI + 6,local_c);
        pIVar1->FontData = (void *)0x0;
      }
    }
  }
  for (local_10 = 0; local_10 < in_RDI[4].Size; local_10 = local_10 + 1) {
    ppIVar2 = ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)(in_RDI + 4),local_10);
    if (in_RDI[6].Data <= (*ppIVar2)->ConfigData) {
      ppIVar2 = ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)(in_RDI + 4),local_10);
      if ((*ppIVar2)->ConfigData < in_RDI[6].Data + in_RDI[6].Size) {
        ppIVar2 = ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)(in_RDI + 4),local_10);
        (*ppIVar2)->ConfigData = (ImFontConfig *)0x0;
        ppIVar2 = ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)(in_RDI + 4),local_10);
        (*ppIVar2)->ConfigDataCount = 0;
      }
    }
  }
  ImVector<ImFontConfig>::clear(in_RDI);
  ImVector<ImFontAtlas::CustomRect>::clear((ImVector<ImFontAtlas::CustomRect> *)in_RDI);
  for (local_14 = 0; local_14 < 1; local_14 = local_14 + 1) {
    (&in_RDI[7].Size)[local_14] = -1;
  }
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < ConfigData.Size; i++)
        if (ConfigData[i].FontData && ConfigData[i].FontDataOwnedByAtlas)
        {
            ImGui::MemFree(ConfigData[i].FontData);
            ConfigData[i].FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (int i = 0; i < Fonts.Size; i++)
        if (Fonts[i]->ConfigData >= ConfigData.Data && Fonts[i]->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            Fonts[i]->ConfigData = NULL;
            Fonts[i]->ConfigDataCount = 0;
        }
    ConfigData.clear();
    CustomRects.clear();
    for (int n = 0; n < IM_ARRAYSIZE(CustomRectIds); n++)
        CustomRectIds[n] = -1;
}